

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::StopCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  Output OStack_18;
  char *params_local;
  
  params_local = params;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::Stop_abi_cxx11_);
    Output::~Output(&OStack_18);
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Stop engine if it is calculating.");
    Output::~Output(&OStack_18);
    return;
  }
  (*this->engine->_vptr_ChessEngine[0x1f])(this->engine,1);
  Thread::Join(&this->thread);
  return;
}

Assistant:

void UCIAdapter::StopCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Stop;
    Output() << "Stop engine if it is calculating.";
    return;
  }

  engine->Stop(ChessEngine::FullStop);
  thread.Join();
}